

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O3

int xc_family_from_id(int id,int *family,int *number)

{
  int iVar1;
  long lVar2;
  xc_func_info_type *pxVar3;
  
  if (xc_lda_known_funct[0] != (xc_func_info_type *)0x0) {
    lVar2 = 0;
    pxVar3 = xc_lda_known_funct[0];
    do {
      if (pxVar3->number == id) {
        if (family != (int *)0x0) {
          *family = 1;
        }
        iVar1 = 1;
        goto LAB_001d9c79;
      }
      pxVar3 = xc_lda_known_funct[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (pxVar3 != (xc_func_info_type *)0x0);
  }
  if (xc_hyb_lda_known_funct[0] != (xc_func_info_type *)0x0) {
    lVar2 = 0;
    pxVar3 = xc_hyb_lda_known_funct[0];
    do {
      if (pxVar3->number == id) {
        if (family != (int *)0x0) {
          *family = 0x80;
        }
        iVar1 = 0x80;
        goto LAB_001d9c79;
      }
      pxVar3 = xc_hyb_lda_known_funct[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (pxVar3 != (xc_func_info_type *)0x0);
  }
  if (xc_gga_known_funct[0] != (xc_func_info_type *)0x0) {
    lVar2 = 0;
    pxVar3 = xc_gga_known_funct[0];
    do {
      if (pxVar3->number == id) {
        if (family != (int *)0x0) {
          *family = 2;
        }
        iVar1 = 2;
        goto LAB_001d9c79;
      }
      pxVar3 = xc_gga_known_funct[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (pxVar3 != (xc_func_info_type *)0x0);
  }
  if (xc_hyb_gga_known_funct[0] != (xc_func_info_type *)0x0) {
    lVar2 = 0;
    pxVar3 = xc_hyb_gga_known_funct[0];
    do {
      if (pxVar3->number == id) {
        if (family != (int *)0x0) {
          *family = 0x20;
        }
        iVar1 = 0x20;
        goto LAB_001d9c79;
      }
      pxVar3 = xc_hyb_gga_known_funct[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (pxVar3 != (xc_func_info_type *)0x0);
  }
  if (xc_mgga_known_funct[0] != (xc_func_info_type *)0x0) {
    lVar2 = 0;
    pxVar3 = xc_mgga_known_funct[0];
    do {
      if (pxVar3->number == id) {
        if (family != (int *)0x0) {
          *family = 4;
        }
        iVar1 = 4;
        goto LAB_001d9c79;
      }
      pxVar3 = xc_mgga_known_funct[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (pxVar3 != (xc_func_info_type *)0x0);
  }
  if (xc_hyb_mgga_known_funct[0] != (xc_func_info_type *)0x0) {
    lVar2 = 0;
    pxVar3 = xc_hyb_mgga_known_funct[0];
    do {
      if (pxVar3->number == id) {
        if (family != (int *)0x0) {
          *family = 0x40;
        }
        iVar1 = 0x40;
LAB_001d9c79:
        if (number == (int *)0x0) {
          return iVar1;
        }
        *number = (int)lVar2;
        return iVar1;
      }
      pxVar3 = xc_hyb_mgga_known_funct[lVar2 + 1];
      lVar2 = lVar2 + 1;
    } while (pxVar3 != (xc_func_info_type *)0x0);
  }
  return -1;
}

Assistant:

int xc_family_from_id(int id, int *family, int *number)
{
  int ii;

  /* first let us check if it is an LDA */
  for(ii=0; xc_lda_known_funct[ii]!=NULL; ii++){
    if(xc_lda_known_funct[ii]->number == id){
      if(family != NULL) *family = XC_FAMILY_LDA;
      if(number != NULL) *number = ii;
      return XC_FAMILY_LDA;
    }
  }

  for(ii=0; xc_hyb_lda_known_funct[ii]!=NULL; ii++){
    if(xc_hyb_lda_known_funct[ii]->number == id){
      if(family != NULL) *family = XC_FAMILY_HYB_LDA;
      if(number != NULL) *number = ii;
      return XC_FAMILY_HYB_LDA;
    }
  }

  /* or is it a GGA? */
  for(ii=0; xc_gga_known_funct[ii]!=NULL; ii++){
    if(xc_gga_known_funct[ii]->number == id){
      if(family != NULL) *family = XC_FAMILY_GGA;
      if(number != NULL) *number = ii;
      return XC_FAMILY_GGA;
    }
  }

  for(ii=0; xc_hyb_gga_known_funct[ii]!=NULL; ii++){
    if(xc_hyb_gga_known_funct[ii]->number == id){
      if(family != NULL) *family = XC_FAMILY_HYB_GGA;
      if(number != NULL) *number = ii;
      return XC_FAMILY_HYB_GGA;
    }
  }

  /* or is it a meta GGA? */
  for(ii=0; xc_mgga_known_funct[ii]!=NULL; ii++){
    if(xc_mgga_known_funct[ii]->number == id){
      if(family != NULL) *family = XC_FAMILY_MGGA;
      if(number != NULL) *number = ii;
      return XC_FAMILY_MGGA;
    }
  }

  for(ii=0; xc_hyb_mgga_known_funct[ii]!=NULL; ii++){
    if(xc_hyb_mgga_known_funct[ii]->number == id){
      if(family != NULL) *family = XC_FAMILY_HYB_MGGA;
      if(number != NULL) *number = ii;
      return XC_FAMILY_HYB_MGGA;
    }
  }

  return XC_FAMILY_UNKNOWN;
}